

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::~IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  IfcElement *this_00;
  void *pvVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x80 = 0x929318;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x68 = 0x929480;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.field_0x108 = 0x929340;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x118 = 0x929368;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    field_0x150 = 0x929390;
  *(undefined8 *)&this[-1].field_0x180 = 0x9293b8;
  *(undefined8 *)&this[-1].UserDefinedFunction.have = 0x9293e0;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x929408;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x929430;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x10 = 0x929458;
  pvVar1 = *(void **)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                      super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject
                      .field_0x40;
  if ((undefined1 *)pvVar1 !=
      &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement
       .super_IfcElement.super_IfcProduct.super_IfcObject.field_0x50) {
    operator_delete(pvVar1);
  }
  this_00 = (IfcElement *)
            &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.
             super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
             field_0x80;
  pvVar1 = *(void **)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                      super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject
                      .field_0x20;
  if ((undefined1 *)pvVar1 !=
      &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement
       .super_IfcElement.super_IfcProduct.super_IfcObject.field_0x30) {
    operator_delete(pvVar1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__009294b0);
  operator_delete(this_00);
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}